

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O2

Sec_MtrStatus_t * Sec_MiterStatus(Sec_MtrStatus_t *__return_storage_ptr__,Aig_Man_t *p)

{
  Aig_Obj_t *pAVar1;
  int iVar2;
  void *pvVar3;
  int iVar4;
  int i;
  int iVar5;
  int local_40;
  int local_3c;
  
  __return_storage_ptr__->nInputs = p->nTruePis;
  __return_storage_ptr__->nNodes = p->nObjs[6] + p->nObjs[5];
  iVar2 = p->nTruePos;
  __return_storage_ptr__->nOutputs = iVar2;
  iVar5 = -1;
  iVar4 = 0;
  local_3c = 0;
  local_40 = 0;
  i = 0;
  do {
    if (iVar2 <= i) {
      __return_storage_ptr__->nSat = local_40;
      __return_storage_ptr__->nUndec = local_3c;
      __return_storage_ptr__->nUnsat = iVar4;
      __return_storage_ptr__->iOut = iVar5;
      return __return_storage_ptr__;
    }
    pvVar3 = Vec_PtrEntry(p->vCos,i);
    pAVar1 = *(Aig_Obj_t **)((long)pvVar3 + 8);
    if (pAVar1 == (Aig_Obj_t *)((ulong)p->pConst1 ^ 1)) {
      iVar4 = iVar4 + 1;
    }
    else {
      if (pAVar1 != p->pConst1) {
        iVar2 = Saig_ObjIsPi(p,(Aig_Obj_t *)((ulong)pAVar1 & 0xfffffffffffffffe));
        if ((iVar2 == 0) &&
           ((((uint)pAVar1 ^
             *(uint *)&((Aig_Obj_t *)((ulong)pAVar1 & 0xfffffffffffffffe))->field_0x18 >> 3) & 1) ==
            0)) {
          local_3c = local_3c + 1;
          goto LAB_0051d908;
        }
      }
      local_40 = local_40 + 1;
      if (iVar5 == -1) {
        iVar5 = i;
      }
    }
LAB_0051d908:
    i = i + 1;
    iVar2 = p->nTruePos;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START

 
////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Checks the status of the miter.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Sec_MtrStatus_t Sec_MiterStatus( Aig_Man_t * p )
{
    Sec_MtrStatus_t Status;
    Aig_Obj_t * pObj, * pChild;
    int i;
    memset( &Status, 0, sizeof(Sec_MtrStatus_t) );
    Status.iOut = -1;
    Status.nInputs  = Saig_ManPiNum( p );
    Status.nNodes   = Aig_ManNodeNum( p );
    Status.nOutputs = Saig_ManPoNum(p);
    Saig_ManForEachPo( p, pObj, i )
    {
        pChild = Aig_ObjChild0(pObj);
        // check if the output is constant 0
        if ( pChild == Aig_ManConst0(p) )
            Status.nUnsat++;
        // check if the output is constant 1
        else if ( pChild == Aig_ManConst1(p) )
        {
            Status.nSat++;
            if ( Status.iOut == -1 )
                Status.iOut = i;
        }
        // check if the output is a primary input
        else if ( Saig_ObjIsPi(p, Aig_Regular(pChild)) )
        {
            Status.nSat++;
            if ( Status.iOut == -1 )
                Status.iOut = i;
        }
    // check if the output is 1 for the 0000 pattern
        else if ( Aig_Regular(pChild)->fPhase != (unsigned)Aig_IsComplement(pChild) )
        {
            Status.nSat++;
            if ( Status.iOut == -1 )
                Status.iOut = i;
        }
        else
            Status.nUndec++;
    }
    return Status;
}